

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall leveldb::log::_Test_PartialLastIsIgnored::_Run(_Test_PartialLastIsIgnored *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string local_1e8;
  int local_1c4;
  undefined1 local_1c0 [24];
  stringstream local_1a8 [392];
  
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"bar","");
  BigString((string *)local_1c0,&local_1e8,0x8000);
  LogTest::Write(&this->super_LogTest,(string *)local_1c0);
  if ((undefined1 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) != local_1c0 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_1c0._1_7_,local_1c0[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  std::__cxx11::string::resize
            ((ulong)&(this->super_LogTest).dest_.contents_,
             (char)(this->super_LogTest).dest_.contents_._M_string_length + -1);
  local_1c0[0] = true;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x1d9;
  std::__cxx11::stringstream::stringstream(local_1a8);
  LogTest::Read_abi_cxx11_(&local_1e8,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [4])"EOF",&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = true;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x1da;
  std::__cxx11::stringstream::stringstream(local_1a8);
  pcVar2 = (this->super_LogTest).report_.message_._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,
             pcVar2 + (this->super_LogTest).report_.message_._M_string_length);
  test::Tester::IsEq<char[1],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [1])0x10f022,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = true;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x1db;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1c4 = 0;
  local_1e8._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>((Tester *)local_1c0,&local_1c4,(unsigned_long *)&local_1e8);
  test::Tester::~Tester((Tester *)local_1c0);
  return;
}

Assistant:

TEST(LogTest, PartialLastIsIgnored) {
  Write(BigString("bar", kBlockSize));
  // Cause a bad record length in the LAST block.
  ShrinkSize(1);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ("", ReportMessage());
  ASSERT_EQ(0, DroppedBytes());
}